

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandReach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  char *local_70;
  Saig_ParBbr_t Pars;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Bbr_ManSetDefaultParams(&Pars);
  local_70 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_001f9d0d:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"TBFLproyvh");
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x6f:
      Pars.fReorderImage = Pars.fReorderImage ^ 1;
      goto LAB_001f9d0d;
    case 0x70:
      Pars.fPartition = Pars.fPartition ^ 1;
      goto LAB_001f9d0d;
    case 0x71:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x78:
      goto switchD_001f9d2a_caseD_71;
    case 0x72:
      Pars.fReorder = Pars.fReorder ^ 1;
      goto LAB_001f9d0d;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      goto LAB_001f9d0d;
    case 0x79:
      Pars.fSkipOutCheck = Pars.fSkipOutCheck ^ 1;
      goto LAB_001f9d0d;
    }
    if (iVar1 != 0x42) {
      if (iVar1 == 0x46) {
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          Pars.nIterMax = iVar1;
          goto LAB_001f9dd1;
        }
        pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
      }
      else if (iVar1 == 0x4c) {
        if (globalUtilOptind < argc) {
          local_70 = argv[globalUtilOptind];
          globalUtilOptind = globalUtilOptind + 1;
          goto LAB_001f9d0d;
        }
        pcVar3 = "Command line switch \"-L\" should be followed by a file name.\n";
      }
      else {
        if (iVar1 != 0x54) {
          if (iVar1 == -1) {
            if (pNtk == (Abc_Ntk_t *)0x0) {
              pcVar3 = "Empty network.\n";
            }
            else {
              if (pNtk->nObjCounts[8] == 0) {
                Abc_Print(-1,"The current network has no latches.\n");
                return 0;
              }
              if (pNtk->ntkType == ABC_NTK_STRASH) {
                iVar2 = Abc_NtkDarReach(pNtk,&Pars);
                pAbc->Status = iVar2;
                pAbc->nFrames = Pars.iFrame;
                Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
                if (local_70 == (char *)0x0) {
                  return 0;
                }
                Abc_NtkWriteLogFile(local_70,pAbc->pCex,pAbc->Status,pAbc->nFrames,"reach");
                return 0;
              }
              pcVar3 = "Reachability analysis works only for AIGs (run \"strash\").\n";
            }
            iVar2 = -1;
            goto LAB_001f9fcf;
          }
          goto switchD_001f9d2a_caseD_71;
        }
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          Pars.TimeLimit = iVar1;
          goto LAB_001f9dd1;
        }
        pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
      }
LAB_001f9ea0:
      Abc_Print(-1,pcVar3);
      goto switchD_001f9d2a_caseD_71;
    }
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-B\" should be followed by an integer.\n";
      goto LAB_001f9ea0;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nBddMax = iVar1;
LAB_001f9dd1:
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_001f9d2a_caseD_71:
      iVar2 = -2;
      Abc_Print(-2,"usage: reach [-TBF num] [-L file] [-proyvh]\n");
      Abc_Print(-2,"\t         verifies sequential miter using BDD-based reachability\n");
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)Pars.TimeLimit);
      Abc_Print(-2,"\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n",
                (ulong)(uint)Pars.nBddMax);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)Pars.nIterMax);
      pcVar3 = "no logging";
      if (local_70 != (char *)0x0) {
        pcVar3 = local_70;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar3);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (Pars.fPartition == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p     : enable partitioned image computation [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (Pars.fReorder == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (Pars.fReorderImage == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n"
                ,pcVar3);
      pcVar3 = "yes";
      if (Pars.fSkipOutCheck == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar3);
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_001f9fcf:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandReach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Saig_ParBbr_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarReach( Abc_Ntk_t * pNtk, Saig_ParBbr_t * pPars );

    // set defaults
    Bbr_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TBFLproyvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'p':
            pPars->fPartition ^= 1;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'o':
            pPars->fReorderImage ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The current network has no latches.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Reachability analysis works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    pAbc->Status  = Abc_NtkDarReach( pNtk, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "reach" );
    return 0;

usage:
    Abc_Print( -2, "usage: reach [-TBF num] [-L file] [-proyvh]\n" );
    Abc_Print( -2, "\t         verifies sequential miter using BDD-based reachability\n" );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-p     : enable partitioned image computation [default = %s]\n", pPars->fPartition? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n", pPars->fReorderImage? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}